

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

void crnlib::FillDistancesPrices(CLzmaEnc *p)

{
  byte bVar1;
  int numBitLevels;
  uint uVar2;
  UInt32 UVar3;
  ulong uVar4;
  uint local_24c;
  UInt32 i_1;
  UInt32 *distancesPrices;
  UInt32 *posSlotPrices;
  UInt16 *encoder;
  UInt32 posSlot_1;
  UInt32 base;
  UInt32 footerBits;
  UInt32 posSlot;
  UInt32 lenToPosState;
  UInt32 i;
  UInt32 tempPrices [128];
  CLzmaEnc *p_local;
  
  for (posSlot = 4; posSlot < 0x80; posSlot = posSlot + 1) {
    bVar1 = p->g_FastPos[posSlot];
    numBitLevels = (bVar1 >> 1) - 1;
    uVar2 = (bVar1 & 1 | 2) << ((byte)numBitLevels & 0x1f);
    UVar3 = RcTree_ReverseGetPrice
                      ((UInt16 *)((long)p + (ulong)(uint)bVar1 * -2 + (ulong)uVar2 * 2 + 0x34146),
                       numBitLevels,posSlot - uVar2,p->ProbPrices);
    (&lenToPosState)[posSlot] = UVar3;
  }
  for (footerBits = 0; footerBits < 4; footerBits = footerBits + 1) {
    uVar4 = (ulong)footerBits;
    for (encoder._0_4_ = 0; (uint)encoder < p->distTableSize; encoder._0_4_ = (uint)encoder + 1) {
      UVar3 = RcTree_GetPrice(p->posSlotEncoder[footerBits],6,(uint)encoder,p->ProbPrices);
      p->posSlotPrices[uVar4][(uint)encoder] = UVar3;
    }
    for (encoder._0_4_ = 0xe; (uint)encoder < p->distTableSize; encoder._0_4_ = (uint)encoder + 1) {
      p->posSlotPrices[uVar4][(uint)encoder] =
           (((uint)encoder >> 1) - 5) * 0x10 + p->posSlotPrices[uVar4][(uint)encoder];
    }
    for (local_24c = 0; local_24c < 4; local_24c = local_24c + 1) {
      p->distancesPrices[footerBits][local_24c] = p->posSlotPrices[uVar4][local_24c];
    }
    for (; local_24c < 0x80; local_24c = local_24c + 1) {
      p->distancesPrices[footerBits][local_24c] =
           p->posSlotPrices[uVar4][p->g_FastPos[local_24c]] + (&lenToPosState)[local_24c];
    }
  }
  p->matchPriceCount = 0;
  return;
}

Assistant:

static void FillDistancesPrices(CLzmaEnc* p) {
  UInt32 tempPrices[kNumFullDistances];
  UInt32 i, lenToPosState;
  for (i = kStartPosModelIndex; i < kNumFullDistances; i++) {
    UInt32 posSlot = GetPosSlot1(i);
    UInt32 footerBits = ((posSlot >> 1) - 1);
    UInt32 base = ((2 | (posSlot & 1)) << footerBits);
    tempPrices[i] = RcTree_ReverseGetPrice(p->posEncoders + base - posSlot - 1, footerBits, i - base, p->ProbPrices);
  }

  for (lenToPosState = 0; lenToPosState < kNumLenToPosStates; lenToPosState++) {
    UInt32 posSlot;
    const CLzmaProb* encoder = p->posSlotEncoder[lenToPosState];
    UInt32* posSlotPrices = p->posSlotPrices[lenToPosState];
    for (posSlot = 0; posSlot < p->distTableSize; posSlot++)
      posSlotPrices[posSlot] = RcTree_GetPrice(encoder, kNumPosSlotBits, posSlot, p->ProbPrices);
    for (posSlot = kEndPosModelIndex; posSlot < p->distTableSize; posSlot++)
      posSlotPrices[posSlot] += ((((posSlot >> 1) - 1) - kNumAlignBits) << kNumBitPriceShiftBits);

    {
      UInt32* distancesPrices = p->distancesPrices[lenToPosState];
      UInt32 i;
      for (i = 0; i < kStartPosModelIndex; i++)
        distancesPrices[i] = posSlotPrices[i];
      for (; i < kNumFullDistances; i++)
        distancesPrices[i] = posSlotPrices[GetPosSlot1(i)] + tempPrices[i];
    }
  }
  p->matchPriceCount = 0;
}